

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_parameters_dense.h
# Opt level: O2

void update_weight<dense_parameters>(vw *param_1,float step_size,dense_parameters *w)

{
  uint32_t uVar1;
  float *pfVar2;
  float *pfVar3;
  
  uVar1 = w->_stride_shift;
  pfVar2 = w->_begin;
  pfVar3 = pfVar2;
  for (; pfVar2 != pfVar3 + w->_weight_mask + 1; pfVar2 = pfVar2 + (1L << ((byte)uVar1 & 0x3f))) {
    *pfVar2 = pfVar2[2] * step_size + *pfVar2;
    pfVar3 = w->_begin;
  }
  return;
}

Assistant:

uint32_t stride() const { return 1 << _stride_shift; }